

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

VmValue * RemapInstructionArgument
                    (ExpressionContext *ctx,VmModule *module,VmValue *argOrig,
                    SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>
                    *variableRemap,
                    SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U>
                    *instructionRemap)

{
  VariableData *pVVar1;
  Node *pNVar2;
  VmInstruction *pVVar3;
  Allocator *pAVar4;
  VmConstant **ppVVar5;
  TypeBase *pTVar6;
  SynBase *pSVar7;
  char *pcVar8;
  VmValueType VVar9;
  undefined4 extraout_var;
  VmConstant *pVVar10;
  int iVar11;
  uint uVar12;
  VmInstruction *argOrigInst;
  uint uVar13;
  uint uVar14;
  
  if (argOrig != (VmValue *)0x0) {
    uVar12 = argOrig->typeID;
    if (uVar12 != 4) {
      if (uVar12 == 2) {
        uVar12 = instructionRemap->bucketCount;
        uVar13 = uVar12 - 1;
        if (uVar12 != 0) {
          uVar14 = *(uint *)((long)&argOrig[1]._vptr_VmValue + 4);
          iVar11 = 0;
          do {
            uVar14 = uVar14 & uVar13;
            pVVar3 = instructionRemap->data[uVar14].key;
            if (pVVar3 == (VmInstruction *)0x0) break;
            if (pVVar3 == (VmInstruction *)argOrig) {
              return &(instructionRemap->data[uVar14].value)->super_VmValue;
            }
            uVar14 = uVar14 + iVar11 + 1;
            iVar11 = iVar11 + 1;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
        }
        __assert_fail("remap",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x19a9,
                      "VmValue *RemapInstructionArgument(ExpressionContext &, VmModule *, VmValue *, const SmallDenseMap<VariableData *, VmConstant *, VariableDataHasher, 16> &, const SmallDenseMap<VmInstruction *, VmInstruction *, VmInstructionHasher, 16> &)"
                     );
      }
      if (uVar12 != 1) goto LAB_00280ffe;
      pVVar1 = (VariableData *)argOrig[1].comment.end;
      if (pVVar1 != (VariableData *)0x0) {
        uVar12 = variableRemap->bucketCount;
        uVar13 = uVar12 - 1;
        if (uVar12 != 0) {
          uVar14 = pVVar1->uniqueId;
          pNVar2 = variableRemap->data;
          iVar11 = 0;
          while( true ) {
            uVar14 = uVar14 & uVar13;
            if (pNVar2[uVar14].key == (VariableData *)0x0) break;
            if (pNVar2[uVar14].key == pVVar1) {
              if (argOrig[1].hasMemoryAccess != true) {
                pVVar10 = CreateConstantPointer
                                    (ctx->allocator,argOrig->source,
                                     *(int *)&argOrig[1]._vptr_VmValue,
                                     (pNVar2[uVar14].value)->container,(argOrig->type).structType,
                                     true);
                if ((argOrig->comment).begin == (argOrig->comment).end) {
                  return &pVVar10->super_VmValue;
                }
                pcVar8 = (argOrig->comment).end;
                (pVVar10->super_VmValue).comment.begin = (argOrig->comment).begin;
                (pVVar10->super_VmValue).comment.end = pcVar8;
                return &pVVar10->super_VmValue;
              }
              iVar11 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0xd8);
              pVVar10 = (VmConstant *)CONCAT44(extraout_var,iVar11);
              pAVar4 = ctx->allocator;
              VVar9 = (argOrig->type).type;
              uVar12 = (argOrig->type).size;
              (pVVar10->super_VmValue).typeID = 1;
              pTVar6 = (argOrig->type).structType;
              pSVar7 = argOrig->source;
              (pVVar10->super_VmValue).type.type = VVar9;
              (pVVar10->super_VmValue).type.size = uVar12;
              (pVVar10->super_VmValue).type.structType = pTVar6;
              (pVVar10->super_VmValue).source = pSVar7;
              (pVVar10->super_VmValue).comment.begin = (char *)0x0;
              (pVVar10->super_VmValue).comment.end = (char *)0x0;
              (pVVar10->super_VmValue).users.allocator = pAVar4;
              (pVVar10->super_VmValue).users.data = (pVVar10->super_VmValue).users.little;
              (pVVar10->super_VmValue).users.count = 0;
              (pVVar10->super_VmValue).users.max = 8;
              (pVVar10->super_VmValue).hasKnownNonSimpleUse = false;
              (pVVar10->super_VmValue).hasSideEffects = false;
              (pVVar10->super_VmValue).hasMemoryAccess = false;
              (pVVar10->super_VmValue).canBeRemoved = true;
              (pVVar10->super_VmValue).hasKnownSimpleUse = false;
              (pVVar10->super_VmValue)._vptr_VmValue = (_func_int **)&PTR__VmValue_003e8d38;
              pVVar10->iValue = 0;
              pVVar10->fValue = (VmFunction *)0x0;
              pVVar10->container = (VariableData *)0x0;
              pVVar10->sValue = (char *)0x0;
              pVVar10->bValue = (VmBlock *)0x0;
              pVVar10->dValue = 0.0;
              pVVar10->lValue = 0;
              pVVar10->isFloat = false;
              pVVar10->isReference = false;
              pVVar10->iValue = *(int *)&argOrig[1]._vptr_VmValue;
              pVVar1 = (pNVar2[uVar14].value)->container;
              pVVar10->container = pVVar1;
              pVVar10->isReference = true;
              uVar12 = (pVVar1->users).count;
              if (uVar12 == (pVVar1->users).max) {
                SmallArray<VmConstant_*,_8U>::grow(&pVVar1->users,uVar12);
              }
              ppVVar5 = (pVVar1->users).data;
              if (ppVVar5 != (VmConstant **)0x0) {
                uVar12 = (pVVar1->users).count;
                (pVVar1->users).count = uVar12 + 1;
                ppVVar5[uVar12] = pVVar10;
                if ((argOrig->comment).begin == (argOrig->comment).end) {
                  return &pVVar10->super_VmValue;
                }
                pcVar8 = (argOrig->comment).end;
                (pVVar10->super_VmValue).comment.begin = (argOrig->comment).begin;
                (pVVar10->super_VmValue).comment.end = pcVar8;
                return &pVVar10->super_VmValue;
              }
              __assert_fail("data",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x162,
                            "void SmallArray<VmConstant *, 8>::push_back(const T &) [T = VmConstant *, N = 8]"
                           );
            }
            uVar14 = uVar14 + iVar11 + 1;
            iVar11 = iVar11 + 1;
            uVar12 = uVar12 - 1;
            if (uVar12 == 0) {
              return argOrig;
            }
          }
        }
      }
    }
    return argOrig;
  }
LAB_00280ffe:
  __assert_fail("!\"unexpected type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0x19b2,
                "VmValue *RemapInstructionArgument(ExpressionContext &, VmModule *, VmValue *, const SmallDenseMap<VariableData *, VmConstant *, VariableDataHasher, 16> &, const SmallDenseMap<VmInstruction *, VmInstruction *, VmInstructionHasher, 16> &)"
               );
}

Assistant:

VmValue* CreateOr(VmModule *module, SynBase *source, VmValue *lhs, VmValue *rhs)
	{
		assert(lhs->type == VmType::Int || lhs->type == VmType::Long);
		assert(lhs->type == rhs->type);

		return CreateInstruction(module, source, lhs->type, VM_INST_BIT_OR, lhs, rhs);
	}